

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disci_intersector.h
# Opt level: O1

bool embree::avx::OrientedDiscMiIntersectorK<4,_8,_true>::occluded
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *Disc)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  Scene *pSVar10;
  Geometry *pGVar11;
  __int_type_conflict _Var12;
  RTCFilterFunctionN p_Var13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  undefined1 auVar29 [16];
  int iVar30;
  uint uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  long lVar36;
  bool bVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [64];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [64];
  undefined1 auVar53 [16];
  undefined1 auVar54 [64];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 local_270;
  undefined8 uStack_268;
  Primitive *local_258;
  RTCFilterFunctionNArguments local_250;
  undefined1 local_220 [32];
  undefined1 local_1f0 [16];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [16];
  undefined1 local_1b0 [16];
  undefined1 local_1a0 [16];
  undefined1 local_190 [16];
  RTCHitN local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined4 local_120;
  undefined4 uStack_11c;
  undefined4 uStack_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined4 local_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  undefined1 local_e0 [32];
  undefined1 local_c0 [16];
  undefined1 local_b0 [16];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  
  pSVar10 = context->scene;
  uVar33 = (ulong)(Disc->primIDs).field_0.i[0];
  pGVar11 = (pSVar10->geometries).items[Disc->sharedGeomID].ptr;
  lVar36 = *(long *)&pGVar11->field_0x58;
  _Var12 = pGVar11[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar38 = *(undefined1 (*) [16])(lVar36 + _Var12 * uVar33);
  uVar32 = (ulong)(Disc->primIDs).field_0.i[1];
  auVar44 = *(undefined1 (*) [16])(lVar36 + _Var12 * uVar32);
  uVar34 = (ulong)(Disc->primIDs).field_0.i[2];
  auVar39 = *(undefined1 (*) [16])(lVar36 + _Var12 * uVar34);
  uVar35 = (ulong)(Disc->primIDs).field_0.i[3];
  auVar43 = *(undefined1 (*) [16])(lVar36 + _Var12 * uVar35);
  auVar50 = vunpcklps_avx(auVar38,auVar39);
  auVar46 = vunpckhps_avx(auVar38,auVar39);
  auVar38 = vunpcklps_avx(auVar44,auVar43);
  auVar47 = vunpckhps_avx(auVar44,auVar43);
  auVar19 = vunpcklps_avx(auVar50,auVar38);
  auVar18 = vunpckhps_avx(auVar50,auVar38);
  auVar20 = vunpcklps_avx(auVar46,auVar47);
  lVar36 = *(long *)&pGVar11[1].time_range.upper;
  p_Var13 = pGVar11[1].intersectionFilterN;
  auVar38 = *(undefined1 (*) [16])(lVar36 + uVar33 * (long)p_Var13);
  auVar44 = *(undefined1 (*) [16])(lVar36 + uVar32 * (long)p_Var13);
  auVar39 = *(undefined1 (*) [16])(lVar36 + uVar34 * (long)p_Var13);
  auVar43 = *(undefined1 (*) [16])(lVar36 + (long)p_Var13 * uVar35);
  auVar50 = vunpcklps_avx(auVar38,auVar39);
  auVar38 = vunpckhps_avx(auVar38,auVar39);
  auVar39 = vunpcklps_avx(auVar44,auVar43);
  auVar44 = vunpckhps_avx(auVar44,auVar43);
  local_190 = vunpcklps_avx(auVar38,auVar44);
  local_1b0 = vunpcklps_avx(auVar50,auVar39);
  local_1a0 = vunpckhps_avx(auVar50,auVar39);
  local_1f0 = vpshufd_avx(ZEXT416(Disc->sharedGeomID),0);
  fVar1 = *(float *)(ray + k * 4 + 0x20);
  auVar50._4_4_ = fVar1;
  auVar50._0_4_ = fVar1;
  auVar50._8_4_ = fVar1;
  auVar50._12_4_ = fVar1;
  fVar2 = *(float *)(ray + k * 4 + 0x40);
  auVar53._4_4_ = fVar2;
  auVar53._0_4_ = fVar2;
  auVar53._8_4_ = fVar2;
  auVar53._12_4_ = fVar2;
  fVar3 = *(float *)(ray + k * 4 + 0x80);
  fVar4 = *(float *)(ray + k * 4 + 0xa0);
  fVar5 = *(float *)(ray + k * 4 + 0xc0);
  auVar38._0_4_ = fVar3 * local_1b0._0_4_ + fVar4 * local_1a0._0_4_ + fVar5 * local_190._0_4_;
  auVar38._4_4_ = fVar3 * local_1b0._4_4_ + fVar4 * local_1a0._4_4_ + fVar5 * local_190._4_4_;
  auVar38._8_4_ = fVar3 * local_1b0._8_4_ + fVar4 * local_1a0._8_4_ + fVar5 * local_190._8_4_;
  auVar38._12_4_ = fVar3 * local_1b0._12_4_ + fVar4 * local_1a0._12_4_ + fVar5 * local_190._12_4_;
  auVar44 = vcmpps_avx(ZEXT416(0) << 0x20,auVar38,4);
  auVar55._8_4_ = 0x3f800000;
  auVar55._0_8_ = &DAT_3f8000003f800000;
  auVar55._12_4_ = 0x3f800000;
  auVar38 = vblendvps_avx(auVar55,auVar38,auVar44);
  auVar39 = vsubps_avx(auVar20,auVar53);
  auVar43 = vsubps_avx(auVar18,auVar50);
  fVar6 = *(float *)(ray + k * 4);
  auVar56._4_4_ = fVar6;
  auVar56._0_4_ = fVar6;
  auVar56._8_4_ = fVar6;
  auVar56._12_4_ = fVar6;
  auVar50 = vsubps_avx(auVar19,auVar56);
  auVar42._0_4_ =
       auVar43._0_4_ * local_1a0._0_4_ + auVar39._0_4_ * local_190._0_4_ +
       local_1b0._0_4_ * auVar50._0_4_;
  auVar42._4_4_ =
       auVar43._4_4_ * local_1a0._4_4_ + auVar39._4_4_ * local_190._4_4_ +
       local_1b0._4_4_ * auVar50._4_4_;
  auVar42._8_4_ =
       auVar43._8_4_ * local_1a0._8_4_ + auVar39._8_4_ * local_190._8_4_ +
       local_1b0._8_4_ * auVar50._8_4_;
  auVar42._12_4_ =
       auVar43._12_4_ * local_1a0._12_4_ + auVar39._12_4_ * local_190._12_4_ +
       local_1b0._12_4_ * auVar50._12_4_;
  local_1c0 = vdivps_avx(auVar42,auVar38);
  uVar7 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar39._4_4_ = uVar7;
  auVar39._0_4_ = uVar7;
  auVar39._8_4_ = uVar7;
  auVar39._12_4_ = uVar7;
  auVar38 = vcmpps_avx(auVar39,local_1c0,2);
  uVar7 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar43._4_4_ = uVar7;
  auVar43._0_4_ = uVar7;
  auVar43._8_4_ = uVar7;
  auVar43._12_4_ = uVar7;
  auVar39 = vcmpps_avx(local_1c0,auVar43,2);
  auVar38 = vandps_avx(auVar39,auVar38);
  auVar39 = vpshufd_avx(ZEXT116(Disc->numPrimitives),0);
  auVar39 = vpcmpgtd_avx(auVar39,_DAT_01ff0cf0);
  auVar38 = vandps_avx(auVar38,auVar39);
  auVar39 = auVar44 & auVar38;
  if ((((auVar39 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
       (auVar39 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar39 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar39[0xf] < '\0') {
    auVar38 = vandps_avx(auVar44,auVar38);
    auVar50 = vunpckhps_avx(auVar46,auVar47);
    fVar14 = local_1c0._0_4_;
    fVar15 = local_1c0._4_4_;
    fVar16 = local_1c0._8_4_;
    fVar17 = local_1c0._12_4_;
    auVar47._0_4_ = fVar6 + fVar3 * fVar14;
    auVar47._4_4_ = fVar6 + fVar3 * fVar15;
    auVar47._8_4_ = fVar6 + fVar3 * fVar16;
    auVar47._12_4_ = fVar6 + fVar3 * fVar17;
    auVar48._0_4_ = fVar1 + fVar4 * fVar14;
    auVar48._4_4_ = fVar1 + fVar4 * fVar15;
    auVar48._8_4_ = fVar1 + fVar4 * fVar16;
    auVar48._12_4_ = fVar1 + fVar4 * fVar17;
    auVar51._0_4_ = fVar2 + fVar5 * fVar14;
    auVar51._4_4_ = fVar2 + fVar5 * fVar15;
    auVar51._8_4_ = fVar2 + fVar5 * fVar16;
    auVar51._12_4_ = fVar2 + fVar5 * fVar17;
    auVar44 = vsubps_avx(auVar47,auVar19);
    auVar39 = vsubps_avx(auVar48,auVar18);
    auVar43 = vsubps_avx(auVar51,auVar20);
    auVar46._0_4_ =
         auVar44._0_4_ * auVar44._0_4_ +
         auVar39._0_4_ * auVar39._0_4_ + auVar43._0_4_ * auVar43._0_4_;
    auVar46._4_4_ =
         auVar44._4_4_ * auVar44._4_4_ +
         auVar39._4_4_ * auVar39._4_4_ + auVar43._4_4_ * auVar43._4_4_;
    auVar46._8_4_ =
         auVar44._8_4_ * auVar44._8_4_ +
         auVar39._8_4_ * auVar39._8_4_ + auVar43._8_4_ * auVar43._8_4_;
    auVar46._12_4_ =
         auVar44._12_4_ * auVar44._12_4_ +
         auVar39._12_4_ * auVar39._12_4_ + auVar43._12_4_ * auVar43._12_4_;
    auVar44._0_4_ = auVar50._0_4_ * auVar50._0_4_;
    auVar44._4_4_ = auVar50._4_4_ * auVar50._4_4_;
    auVar44._8_4_ = auVar50._8_4_ * auVar50._8_4_;
    auVar44._12_4_ = auVar50._12_4_ * auVar50._12_4_;
    auVar44 = vcmpps_avx(auVar46,auVar44,1);
    auVar38 = vandps_avx(auVar44,auVar38);
    iVar30 = vmovmskps_avx(auVar38);
    if (iVar30 != 0) {
      auVar49 = ZEXT1264(ZEXT412(0)) << 0x20;
      local_1e0 = ZEXT1232(ZEXT412(0)) << 0x20;
      uVar33 = (ulong)(byte)iVar30;
      uVar31 = 1 << ((byte)k & 0x1f);
      uVar32 = (ulong)((uVar31 & 0xf) << 4);
      lVar36 = (long)((int)uVar31 >> 4) * 0x10;
      auVar52 = ZEXT464(0) << 0x20;
      auVar54 = ZEXT3264(CONCAT428(0xff800000,
                                   CONCAT424(0xff800000,
                                             CONCAT420(0xff800000,
                                                       CONCAT416(0xff800000,
                                                                 CONCAT412(0xff800000,
                                                                           CONCAT48(0xff800000,
                                                                                                                                                                        
                                                  0xff800000ff800000)))))));
      do {
        local_250.valid = (int *)&local_280;
        uVar34 = 0;
        if (uVar33 != 0) {
          for (; (uVar33 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
          }
        }
        uVar31 = *(uint *)(local_1f0 + uVar34 * 4);
        pGVar11 = (pSVar10->geometries).items[uVar31].ptr;
        if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
          uVar33 = uVar33 ^ 1L << (uVar34 & 0x3f);
          bVar37 = true;
        }
        else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                (pGVar11->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
          bVar37 = false;
        }
        else {
          uVar7 = *(undefined4 *)(ray + k * 4 + 0x100);
          local_120 = *(undefined4 *)(local_1e0 + uVar34 * 4);
          local_100 = *(undefined4 *)(local_1e0 + uVar34 * 4 + 0x10);
          *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_1c0 + uVar34 * 4);
          local_250.context = context->user;
          local_b0 = vpshufd_avx(ZEXT416(uVar31),0);
          uVar31 = (Disc->primIDs).field_0.i[uVar34];
          local_e0._4_4_ = uVar31;
          local_e0._0_4_ = uVar31;
          local_e0._8_4_ = uVar31;
          local_e0._12_4_ = uVar31;
          local_e0._16_4_ = uVar31;
          local_e0._20_4_ = uVar31;
          local_e0._24_4_ = uVar31;
          local_e0._28_4_ = uVar31;
          uVar8 = *(undefined4 *)(local_1b0 + uVar34 * 4);
          uVar9 = *(undefined4 *)(local_1a0 + uVar34 * 4);
          local_160._4_4_ = uVar9;
          local_160._0_4_ = uVar9;
          local_160._8_4_ = uVar9;
          local_160._12_4_ = uVar9;
          local_160._16_4_ = uVar9;
          local_160._20_4_ = uVar9;
          local_160._24_4_ = uVar9;
          local_160._28_4_ = uVar9;
          uVar9 = *(undefined4 *)(local_190 + uVar34 * 4);
          local_140._4_4_ = uVar9;
          local_140._0_4_ = uVar9;
          local_140._8_4_ = uVar9;
          local_140._12_4_ = uVar9;
          local_140._16_4_ = uVar9;
          local_140._20_4_ = uVar9;
          local_140._24_4_ = uVar9;
          local_140._28_4_ = uVar9;
          local_180[0] = (RTCHitN)(char)uVar8;
          local_180[1] = (RTCHitN)(char)((uint)uVar8 >> 8);
          local_180[2] = (RTCHitN)(char)((uint)uVar8 >> 0x10);
          local_180[3] = (RTCHitN)(char)((uint)uVar8 >> 0x18);
          local_180[4] = (RTCHitN)(char)uVar8;
          local_180[5] = (RTCHitN)(char)((uint)uVar8 >> 8);
          local_180[6] = (RTCHitN)(char)((uint)uVar8 >> 0x10);
          local_180[7] = (RTCHitN)(char)((uint)uVar8 >> 0x18);
          local_180[8] = (RTCHitN)(char)uVar8;
          local_180[9] = (RTCHitN)(char)((uint)uVar8 >> 8);
          local_180[10] = (RTCHitN)(char)((uint)uVar8 >> 0x10);
          local_180[0xb] = (RTCHitN)(char)((uint)uVar8 >> 0x18);
          local_180[0xc] = (RTCHitN)(char)uVar8;
          local_180[0xd] = (RTCHitN)(char)((uint)uVar8 >> 8);
          local_180[0xe] = (RTCHitN)(char)((uint)uVar8 >> 0x10);
          local_180[0xf] = (RTCHitN)(char)((uint)uVar8 >> 0x18);
          local_180[0x10] = (RTCHitN)(char)uVar8;
          local_180[0x11] = (RTCHitN)(char)((uint)uVar8 >> 8);
          local_180[0x12] = (RTCHitN)(char)((uint)uVar8 >> 0x10);
          local_180[0x13] = (RTCHitN)(char)((uint)uVar8 >> 0x18);
          local_180[0x14] = (RTCHitN)(char)uVar8;
          local_180[0x15] = (RTCHitN)(char)((uint)uVar8 >> 8);
          local_180[0x16] = (RTCHitN)(char)((uint)uVar8 >> 0x10);
          local_180[0x17] = (RTCHitN)(char)((uint)uVar8 >> 0x18);
          local_180[0x18] = (RTCHitN)(char)uVar8;
          local_180[0x19] = (RTCHitN)(char)((uint)uVar8 >> 8);
          local_180[0x1a] = (RTCHitN)(char)((uint)uVar8 >> 0x10);
          local_180[0x1b] = (RTCHitN)(char)((uint)uVar8 >> 0x18);
          local_180[0x1c] = (RTCHitN)(char)uVar8;
          local_180[0x1d] = (RTCHitN)(char)((uint)uVar8 >> 8);
          local_180[0x1e] = (RTCHitN)(char)((uint)uVar8 >> 0x10);
          local_180[0x1f] = (RTCHitN)(char)((uint)uVar8 >> 0x18);
          uStack_11c = local_120;
          uStack_118 = local_120;
          uStack_114 = local_120;
          uStack_110 = local_120;
          uStack_10c = local_120;
          uStack_108 = local_120;
          uStack_104 = local_120;
          uStack_fc = local_100;
          uStack_f8 = local_100;
          uStack_f4 = local_100;
          uStack_f0 = local_100;
          uStack_ec = local_100;
          uStack_e8 = local_100;
          uStack_e4 = local_100;
          local_c0 = local_b0;
          local_220 = vcmpps_avx(auVar49._0_32_,auVar49._0_32_,0xf);
          uStack_9c = (local_250.context)->instID[0];
          local_a0 = uStack_9c;
          uStack_98 = uStack_9c;
          uStack_94 = uStack_9c;
          uStack_90 = uStack_9c;
          uStack_8c = uStack_9c;
          uStack_88 = uStack_9c;
          uStack_84 = uStack_9c;
          uStack_7c = (local_250.context)->instPrimID[0];
          local_80 = uStack_7c;
          uStack_78 = uStack_7c;
          uStack_74 = uStack_7c;
          uStack_70 = uStack_7c;
          uStack_6c = uStack_7c;
          uStack_68 = uStack_7c;
          uStack_64 = uStack_7c;
          local_280 = *(undefined8 *)(mm_lookupmask_ps + uVar32);
          uStack_278 = *(undefined8 *)(mm_lookupmask_ps + uVar32 + 8);
          local_270 = *(undefined8 *)(mm_lookupmask_ps + lVar36);
          uStack_268 = *(undefined8 *)(mm_lookupmask_ps + lVar36 + 8);
          local_250.geometryUserPtr = pGVar11->userPtr;
          local_250.hit = local_180;
          local_250.N = 8;
          local_250.ray = (RTCRayN *)ray;
          if (pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            local_258 = Disc;
            (*pGVar11->occlusionFilterN)(&local_250);
            auVar54 = ZEXT3264(CONCAT428(0xff800000,
                                         CONCAT424(0xff800000,
                                                   CONCAT420(0xff800000,
                                                             CONCAT416(0xff800000,
                                                                       CONCAT412(0xff800000,
                                                                                 CONCAT48(0xff800000
                                                                                          ,
                                                  0xff800000ff800000)))))));
            auVar52 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar49 = ZEXT1664(ZEXT816(0) << 0x40);
            Disc = local_258;
          }
          auVar18._8_8_ = uStack_278;
          auVar18._0_8_ = local_280;
          auVar38 = vpcmpeqd_avx(auVar52._0_16_,auVar18);
          auVar19._8_8_ = uStack_268;
          auVar19._0_8_ = local_270;
          auVar44 = vpcmpeqd_avx(auVar52._0_16_,auVar19);
          auVar40._16_16_ = auVar44;
          auVar40._0_16_ = auVar38;
          auVar40 = local_220 & ~auVar40;
          if ((((((((auVar40 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar40 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar40 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar40 >> 0x7f,0) == '\0') &&
                (auVar40 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar40 >> 0xbf,0) == '\0') &&
              (auVar40 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar40[0x1f]) {
            auVar41._0_4_ = auVar38._0_4_ ^ local_220._0_4_;
            auVar41._4_4_ = auVar38._4_4_ ^ local_220._4_4_;
            auVar41._8_4_ = auVar38._8_4_ ^ local_220._8_4_;
            auVar41._12_4_ = auVar38._12_4_ ^ local_220._12_4_;
            auVar41._16_4_ = auVar44._0_4_ ^ local_220._16_4_;
            auVar41._20_4_ = auVar44._4_4_ ^ local_220._20_4_;
            auVar41._24_4_ = auVar44._8_4_ ^ local_220._24_4_;
            auVar41._28_4_ = auVar44._12_4_ ^ local_220._28_4_;
          }
          else {
            p_Var13 = context->args->filter;
            if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var13)(&local_250);
              auVar54 = ZEXT3264(CONCAT428(0xff800000,
                                           CONCAT424(0xff800000,
                                                     CONCAT420(0xff800000,
                                                               CONCAT416(0xff800000,
                                                                         CONCAT412(0xff800000,
                                                                                   CONCAT48(
                                                  0xff800000,0xff800000ff800000)))))));
              auVar52 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar49 = ZEXT1664(ZEXT816(0) << 0x40);
            }
            auVar20._8_8_ = uStack_278;
            auVar20._0_8_ = local_280;
            auVar38 = vpcmpeqd_avx(auVar52._0_16_,auVar20);
            auVar29._8_8_ = uStack_268;
            auVar29._0_8_ = local_270;
            auVar44 = vpcmpeqd_avx(auVar52._0_16_,auVar29);
            auVar45._16_16_ = auVar44;
            auVar45._0_16_ = auVar38;
            auVar41._0_4_ = auVar38._0_4_ ^ local_220._0_4_;
            auVar41._4_4_ = auVar38._4_4_ ^ local_220._4_4_;
            auVar41._8_4_ = auVar38._8_4_ ^ local_220._8_4_;
            auVar41._12_4_ = auVar38._12_4_ ^ local_220._12_4_;
            auVar41._16_4_ = auVar44._0_4_ ^ local_220._16_4_;
            auVar41._20_4_ = auVar44._4_4_ ^ local_220._20_4_;
            auVar41._24_4_ = auVar44._8_4_ ^ local_220._24_4_;
            auVar41._28_4_ = auVar44._12_4_ ^ local_220._28_4_;
            auVar40 = vblendvps_avx(auVar54._0_32_,*(undefined1 (*) [32])(local_250.ray + 0x100),
                                    auVar45);
            *(undefined1 (*) [32])(local_250.ray + 0x100) = auVar40;
          }
          bVar27 = (auVar41 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
          bVar28 = (auVar41 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
          bVar26 = (auVar41 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
          bVar25 = SUB321(auVar41 >> 0x7f,0) == '\0';
          bVar24 = (auVar41 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
          bVar23 = SUB321(auVar41 >> 0xbf,0) == '\0';
          bVar22 = (auVar41 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
          bVar21 = -1 < auVar41[0x1f];
          bVar37 = ((((((bVar27 && bVar28) && bVar26) && bVar25) && bVar24) && bVar23) && bVar22) &&
                   bVar21;
          if (((((((bVar27 && bVar28) && bVar26) && bVar25) && bVar24) && bVar23) && bVar22) &&
              bVar21) {
            *(undefined4 *)(ray + k * 4 + 0x100) = uVar7;
            uVar33 = uVar33 ^ 1L << (uVar34 & 0x3f);
          }
        }
      } while ((bVar37 != false) && (uVar33 != 0));
      return (bool)(bVar37 ^ 1);
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(
          const Precalculations& pre, RayK<K>& ray, size_t k, RayQueryContext* context, const Primitive& Disc)
      {
        STAT3(shadow.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(Disc.geomID());
        Vec4vf<M> v0; Vec3vf<M> n0;
        Disc.gather(v0, n0, geom);
        const vbool<M> valid = Disc.valid();
        return DiscIntersectorK<M, K>::intersect(
            valid, ray, k, context, geom, pre, v0, n0,
            Occluded1KEpilogM<M, K, filter>(ray, k, context, Disc.geomID(), Disc.primID()));
      }